

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirectivesParser.cpp
# Opt level: O0

unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>
parseDirectiveHeaderSize(Parser *parser,int flags)

{
  bool bVar1;
  undefined4 in_register_00000034;
  Expression local_50;
  undefined1 local_38 [8];
  Expression exp;
  int flags_local;
  Parser *parser_local;
  
  Parser::parseExpression((Expression *)local_38,(Parser *)CONCAT44(in_register_00000034,flags));
  bVar1 = Expression::isLoaded((Expression *)local_38);
  if (bVar1) {
    std::make_unique<CDirectiveHeaderSize,Expression&>(&local_50);
    std::unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>>::
    unique_ptr<CDirectiveHeaderSize,std::default_delete<CDirectiveHeaderSize>,void>
              ((unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>> *)parser,
               (unique_ptr<CDirectiveHeaderSize,_std::default_delete<CDirectiveHeaderSize>_> *)
               &local_50);
    std::unique_ptr<CDirectiveHeaderSize,_std::default_delete<CDirectiveHeaderSize>_>::~unique_ptr
              ((unique_ptr<CDirectiveHeaderSize,_std::default_delete<CDirectiveHeaderSize>_> *)
               &local_50);
  }
  else {
    std::unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>>::
    unique_ptr<std::default_delete<CAssemblerCommand>,void>
              ((unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>> *)parser,
               (nullptr_t)0x0);
  }
  local_50.expression.super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi._0_4_ = 1;
  Expression::~Expression((Expression *)local_38);
  return (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         parser;
}

Assistant:

std::unique_ptr<CAssemblerCommand> parseDirectiveHeaderSize(Parser& parser, int flags)
{
	Expression exp = parser.parseExpression();
	if (!exp.isLoaded())
		return nullptr;

	return std::make_unique<CDirectiveHeaderSize>(exp);
}